

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O1

shared_ptr<Expr> __thiscall Parser::rel(Parser *this)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  Parser *in_RSI;
  shared_ptr<Expr> sVar4;
  shared_ptr<Token> tok;
  undefined1 local_49;
  shared_ptr<Token> local_48;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  sVar4 = expr(this);
  _Var3 = sVar4.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_48.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (in_RSI->look).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar1 = (local_48.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->tag;
  if (iVar1 < 0x107) {
    if ((iVar1 != 0x3c) && (iVar1 != 0x3e)) goto LAB_0010d4cf;
  }
  else if ((iVar1 != 0x10b) && (iVar1 != 0x107)) goto LAB_0010d4cf;
  local_48.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (in_RSI->look).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_48.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_48.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_48.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  move(in_RSI);
  expr((Parser *)&stack0xffffffffffffffe0);
  local_38 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Rel,std::allocator<Rel>,std::shared_ptr<Token>&,std::shared_ptr<Expr>&,std::shared_ptr<Expr>>
            (a_Stack_30,(Rel **)&local_38,(allocator<Rel> *)&local_49,&local_48,
             (shared_ptr<Expr> *)this,(shared_ptr<Expr> *)&stack0xffffffffffffffe0);
  std::__shared_ptr<Rel,(__gnu_cxx::_Lock_policy)2>::_M_enable_shared_from_this_with<Rel,Rel>
            ((__shared_ptr<Rel,(__gnu_cxx::_Lock_policy)2> *)&local_38,(Rel *)local_38);
  _Var3._M_pi = a_Stack_30[0]._M_pi;
  peVar2 = local_38;
  local_38 = (element_type *)0x0;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->top).super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->top).super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->top).super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  _Var3._M_pi = extraout_RDX;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var3._M_pi = extraout_RDX_00;
  }
  if (a_Stack_30[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_30[0]._M_pi);
    _Var3._M_pi = extraout_RDX_01;
  }
  if (local_18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18._M_pi);
    _Var3._M_pi = extraout_RDX_02;
  }
  if (local_48.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var3._M_pi = extraout_RDX_03;
  }
LAB_0010d4cf:
  sVar4.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar4.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Expr>)sVar4.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expr> rel() {
		std::shared_ptr<Expr> x = expr();
		switch (look->tag) {
		case '<':
		case LE:
		case GE:
		case '>':
			{
				std::shared_ptr<Token> tok = look; move();
				x = std::make_shared<Rel>(tok, x, expr());
			}
		default:
			return x;
			break;
		}
	}